

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timTime.c
# Opt level: O2

void Tim_ManSetCiRequired(Tim_Man_t *p,int iCi,float Delay)

{
  Tim_Obj_t *pTVar1;
  int iVar2;
  
  if (p->nCis <= iCi) {
    __assert_fail("iCi < p->nCis",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timTime.c"
                  ,0x89,"void Tim_ManSetCiRequired(Tim_Man_t *, int, float)");
  }
  pTVar1 = p->pCis;
  if (p->fUseTravId == 0) {
    iVar2 = p->nTravIds;
  }
  else {
    iVar2 = p->nTravIds;
    if (pTVar1[iCi].TravId == iVar2) {
      __assert_fail("!p->fUseTravId || p->pCis[iCi].TravId != p->nTravIds",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timTime.c"
                    ,0x8a,"void Tim_ManSetCiRequired(Tim_Man_t *, int, float)");
    }
  }
  pTVar1[iCi].timeReq = Delay;
  pTVar1[iCi].TravId = iVar2;
  return;
}

Assistant:

void Tim_ManSetCiRequired( Tim_Man_t * p, int iCi, float Delay )
{
    assert( iCi < p->nCis );
    assert( !p->fUseTravId || p->pCis[iCi].TravId != p->nTravIds );
    p->pCis[iCi].timeReq = Delay;
    p->pCis[iCi].TravId = p->nTravIds;
}